

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O0

void __thiscall ncnn::Yolov1Detection::Yolov1Detection(Yolov1Detection *this)

{
  Layer *pLVar1;
  undefined8 *in_RDI;
  ParamDict pd;
  Layer *in_stack_fffffffffffff6e0;
  undefined1 local_918 [4];
  anon_union_4_2_947300a4_for_anon_struct_72_3_b6d6cd30_1 in_stack_fffffffffffff6ec;
  ParamDict *in_stack_fffffffffffff6f0;
  ParamDict *in_stack_fffffffffffff720;
  
  Layer::Layer(in_stack_fffffffffffff6e0);
  *in_RDI = &PTR__Yolov1Detection_001f0cd8;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 1;
  pLVar1 = create_layer(in_stack_fffffffffffff6ec.i);
  in_RDI[0x14] = pLVar1;
  ParamDict::ParamDict(in_stack_fffffffffffff720);
  ParamDict::set((ParamDict *)local_918,0,1);
  ParamDict::set((ParamDict *)local_918,1,1);
  (**(code **)(*(long *)in_RDI[0x14] + 0x10))((long *)in_RDI[0x14],local_918);
  ParamDict::~ParamDict(in_stack_fffffffffffff6f0);
  return;
}

Assistant:

Yolov1Detection::Yolov1Detection()
{
    one_blob_only = true;
    support_inplace = true;

    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
    ncnn::ParamDict pd;
    pd.set(0, 1);
    pd.set(1, 1);
    softmax->load_param(pd);
}